

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardVariableSpecification.cpp
# Opt level: O3

bool __thiscall
DIS::StandardVariableSpecification::operator==
          (StandardVariableSpecification *this,StandardVariableSpecification *rhs)

{
  bool bVar1;
  bool bVar2;
  pointer pSVar3;
  ulong uVar4;
  long lVar5;
  
  pSVar3 = (this->_standardVariables).
           super__Vector_base<DIS::SimulationManagementPduHeader,_std::allocator<DIS::SimulationManagementPduHeader>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_standardVariables).
      super__Vector_base<DIS::SimulationManagementPduHeader,_std::allocator<DIS::SimulationManagementPduHeader>_>
      ._M_impl.super__Vector_impl_data._M_finish == pSVar3) {
    bVar2 = true;
  }
  else {
    bVar2 = true;
    lVar5 = 0;
    uVar4 = 0;
    do {
      bVar1 = SimulationManagementPduHeader::operator==
                        ((SimulationManagementPduHeader *)
                         ((long)&pSVar3->_vptr_SimulationManagementPduHeader + lVar5),
                         (SimulationManagementPduHeader *)
                         ((long)&((rhs->_standardVariables).
                                  super__Vector_base<DIS::SimulationManagementPduHeader,_std::allocator<DIS::SimulationManagementPduHeader>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                 _vptr_SimulationManagementPduHeader + lVar5));
      bVar2 = (bool)(bVar2 & bVar1);
      uVar4 = uVar4 + 1;
      pSVar3 = (this->_standardVariables).
               super__Vector_base<DIS::SimulationManagementPduHeader,_std::allocator<DIS::SimulationManagementPduHeader>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x60;
    } while (uVar4 < (ulong)(((long)(this->_standardVariables).
                                    super__Vector_base<DIS::SimulationManagementPduHeader,_std::allocator<DIS::SimulationManagementPduHeader>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar3 >> 5)
                            * -0x5555555555555555));
  }
  return bVar2;
}

Assistant:

bool StandardVariableSpecification::operator ==(const StandardVariableSpecification& rhs) const
 {
     bool ivarsEqual = true;


     for(size_t idx = 0; idx < _standardVariables.size(); idx++)
     {
        if( ! ( _standardVariables[idx] == rhs._standardVariables[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }